

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeB(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  iVar1 = this->v;
  lVar3 = (long)iVar1;
  if (mode != m_black) {
    pfVar2 = this->kv;
    if (iVar1 == 0) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = 0.0;
      lVar4 = 0;
      do {
        fVar5 = fVar5 + *(float *)((long)pfVar2 + lVar4);
        lVar4 = lVar4 + 4;
      } while (-lVar4 != lVar3 * 4);
    }
    pfVar2[-lVar3] = fVar5 + pfVar2[-lVar3];
  }
  this->kv = this->kv + -iVar1;
  this->vw = this->vw + iVar1;
  this->v = 0;
  return;
}

Assistant:

void mergeB(BorderMode mode)
    {
        int w = -v;
        if (mode != m_black)
            kv[w] += accumulate(kv, w);
        kv += w;
        vw -= w;
        v = 0;
    }